

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

string * __thiscall CodeGen::unionName_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this)

{
  long lVar1;
  unsigned_long *arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string s;
  size_t local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&s,(string *)&this->schemaFile_);
  lVar1 = std::__cxx11::string::find_last_of((char *)&s,0x1812e0);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  makeCanonical(&s,false);
  std::operator+(&local_38,&s,"_Union__");
  local_60 = this->unionNumber_;
  this->unionNumber_ = local_60 + 1;
  boost::lexical_cast<std::__cxx11::string,unsigned_long>(&local_58,(boost *)&local_60,arg);
  std::operator+(&local_a0,&local_38,&local_58);
  std::operator+(__return_storage_ptr__,&local_a0,"__");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::unionName()
{
    string s = schemaFile_;
    string::size_type n = s.find_last_of("/\\");
    if (n != string::npos) {
        s = s.substr(n);
    }
    makeCanonical(s, false);

    return s + "_Union__" + boost::lexical_cast<string>(unionNumber_++) + "__";
}